

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

uint16_t bssl::dtls_record_version(SSL *ssl)

{
  uint16_t uVar1;
  uint16_t uVar2;
  
  if (ssl->s3->version == 0) {
    uVar2 = 0xfeff;
  }
  else {
    uVar1 = ssl_protocol_version(ssl);
    uVar2 = 0xfefd;
    if (uVar1 < 0x304) {
      uVar2 = ssl->s3->version;
    }
  }
  return uVar2;
}

Assistant:

static uint16_t dtls_record_version(const SSL *ssl) {
  if (ssl->s3->version == 0) {
    // Before the version is determined, outgoing records use dTLS 1.0 for
    // historical compatibility requirements.
    return DTLS1_VERSION;
  }
  // DTLS 1.3 freezes the record version at DTLS 1.2. Previous ones use the
  // version itself.
  return ssl_protocol_version(ssl) >= TLS1_3_VERSION ? DTLS1_2_VERSION
                                                     : ssl->s3->version;
}